

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_CLASS::Load
          (_Type_CLASS *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Class *this_00;
  Memory *pMVar2;
  undefined8 uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *name;
  code *pcVar9;
  long in_R8;
  string key;
  Nullable<LiteScript::Variable> local_80;
  Nullable<LiteScript::Variable> local_60;
  Variable local_40;
  
  Object::Reassign(object,(Type *)_type_class,0x478);
  Class::Class((Class *)object->data,object->memory);
  this_00 = (Class *)object->data;
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  uVar7 = std::istream::get();
  iVar8 = std::istream::get();
  uVar5 = iVar8 << 0x18 | (uVar7 & 0xff) << 0x10 | (uVar6 & 0xff) << 8 | uVar5 & 0xff;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pMVar2 = object->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
      pcVar9 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar9 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar7 = (*pcVar9)(plVar1,stream);
      Memory::GetVariable(&local_80,pMVar2,uVar7);
      Variable::Variable((Variable *)&local_60,(Variable *)&local_80);
      Class::Inherit(this_00,(Variable *)&local_60);
      Variable::~Variable((Variable *)&local_60);
      if (local_80.is_null == false) {
        Variable::~Variable((Variable *)&local_80);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  local_80.data._0_8_ = (long)&local_80 + 0x10;
  local_80.data[8] = '\0';
  local_80.data[9] = '\0';
  local_80.data[10] = '\0';
  local_80.data[0xb] = '\0';
  local_80.data[0xc] = '\0';
  local_80.data[0xd] = '\0';
  local_80.data[0xe] = '\0';
  local_80.data[0xf] = '\0';
  local_80.is_null = false;
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  uVar7 = std::istream::get();
  iVar8 = std::istream::get();
  uVar5 = (uVar7 & 0xff) << 0x10 | iVar8 << 0x18 | (uVar6 & 0xff) << 8 | uVar5 & 0xff;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      local_80.data[8] = '\0';
      local_80.data[9] = '\0';
      local_80.data[10] = '\0';
      local_80.data[0xb] = '\0';
      local_80.data[0xc] = '\0';
      local_80.data[0xd] = '\0';
      local_80.data[0xe] = '\0';
      local_80.data[0xf] = '\0';
      *(char *)local_80.data._0_8_ = '\0';
      while( true ) {
        cVar4 = std::istream::get();
        uVar3 = local_80.data._0_8_;
        if (cVar4 == '\0') break;
        std::__cxx11::string::push_back((char)&local_80);
      }
      pMVar2 = object->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
      pcVar9 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar9 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar7 = (*pcVar9)(plVar1,stream);
      Memory::GetVariable(&local_60,pMVar2,uVar7);
      Variable::Variable(&local_40,(Variable *)&local_60);
      Class::AddStatic(this_00,(char *)uVar3,&local_40);
      Variable::~Variable(&local_40);
      if (local_60.is_null == false) {
        Variable::~Variable((Variable *)&local_60);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  uVar7 = std::istream::get();
  iVar8 = std::istream::get();
  uVar5 = (uVar7 & 0xff) << 0x10 | iVar8 << 0x18 | (uVar6 & 0xff) << 8 | uVar5 & 0xff;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      local_80.data[8] = '\0';
      local_80.data[9] = '\0';
      local_80.data[10] = '\0';
      local_80.data[0xb] = '\0';
      local_80.data[0xc] = '\0';
      local_80.data[0xd] = '\0';
      local_80.data[0xe] = '\0';
      local_80.data[0xf] = '\0';
      *(char *)local_80.data._0_8_ = '\0';
      while( true ) {
        cVar4 = std::istream::get();
        uVar3 = local_80.data._0_8_;
        if (cVar4 == '\0') break;
        std::__cxx11::string::push_back((char)&local_80);
      }
      pMVar2 = object->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
      pcVar9 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar9 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar7 = (*pcVar9)(plVar1,stream);
      Memory::GetVariable(&local_60,pMVar2,uVar7);
      Variable::Variable(&local_40,(Variable *)&local_60);
      Class::AddUnstatic(this_00,(char *)uVar3,&local_40);
      Variable::~Variable(&local_40);
      if (local_60.is_null == false) {
        Variable::~Variable((Variable *)&local_60);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  uVar5 = std::istream::get();
  uVar6 = std::istream::get();
  uVar7 = std::istream::get();
  iVar8 = std::istream::get();
  uVar5 = (uVar7 & 0xff) << 0x10 | iVar8 << 0x18 | (uVar6 & 0xff) << 8 | uVar5 & 0xff;
  if (uVar5 != 0xffffffff) {
    name = Class::GetUnstaticName(this_00,uVar5);
    Class::DefineConstructor(this_00,name);
  }
  uVar5 = 0;
  do {
    iVar8 = std::istream::get();
    if (iVar8 != 0) {
      pMVar2 = object->memory;
      plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
      pcVar9 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar9 = *(code **)(*plVar1 + -1 + caller);
      }
      uVar6 = (*pcVar9)(plVar1,stream);
      Memory::GetVariable(&local_60,pMVar2,uVar6);
      Variable::Variable(&local_40,(Variable *)&local_60);
      Class::AddOperator(this_00,uVar5,&local_40);
      Variable::~Variable(&local_40);
      if (local_60.is_null == false) {
        Variable::~Variable((Variable *)&local_60);
      }
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x21);
  if ((char *)local_80.data._0_8_ != (char *)((long)&local_80 + 0x10U)) {
    operator_delete((void *)local_80.data._0_8_);
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::CLASS, sizeof(Class));
    std::allocator<Class> allocator;
    allocator.construct(&object.GetData<Class>(), object.memory);
    Class& C = object.GetData<Class>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        C.Inherit(object.memory.GetVariable((object.memory.*caller)(stream)));
    std::string key;
    unsigned char c;
    sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            key += c;
        C.AddStatic(key.c_str(), object.memory.GetVariable((object.memory.*caller)(stream)));
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            key += c;
        C.AddUnstatic(key.c_str(), object.memory.GetVariable((object.memory.*caller)(stream)));
    }
    int cidx = IStreamer::Read<int>(stream);
    if (cidx != -1)
        C.DefineConstructor(C.GetUnstaticName((unsigned int)cidx));
    for (unsigned int i = 0; i < Class::OperatorType::OP_TYPE_NUMBER; i++) {
        if (stream.get() != 0)
            C.AddOperator(i, object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}